

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O2

void cdef_filter_8_1_avx2
               (void *dest,int dstride,uint16_t *in,int pri_strength,int sec_strength,int dir,
               int pri_damping,int sec_damping,int coeff_shift,int block_width,int block_height)

{
  undefined2 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  bool bVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [16];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar40 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar41 [32];
  undefined1 auVar42 [16];
  undefined1 auVar46 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [16];
  
  bVar10 = ((uint)pri_strength >> (coeff_shift & 0x1fU) & 1) != 0;
  lVar4 = (long)cdef_directions_padded[(long)dir + 2][0];
  lVar5 = (long)cdef_directions_padded[(long)dir + 2][1];
  auVar19._0_2_ = (undefined2)pri_strength;
  if (block_width == 8) {
    uVar6 = pri_damping;
    if (pri_strength != 0) {
      iVar2 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = pri_damping - iVar2;
      if (pri_damping < iVar2) {
        uVar6 = 0;
      }
    }
    auVar19._2_2_ = auVar19._0_2_;
    auVar19._4_2_ = auVar19._0_2_;
    auVar19._6_2_ = auVar19._0_2_;
    auVar19._8_2_ = auVar19._0_2_;
    auVar19._10_2_ = auVar19._0_2_;
    auVar19._12_2_ = auVar19._0_2_;
    auVar19._14_2_ = auVar19._0_2_;
    auVar19._16_2_ = auVar19._0_2_;
    auVar19._18_2_ = auVar19._0_2_;
    auVar19._20_2_ = auVar19._0_2_;
    auVar19._22_2_ = auVar19._0_2_;
    auVar19._24_2_ = auVar19._0_2_;
    auVar19._26_2_ = auVar19._0_2_;
    auVar19._28_2_ = auVar19._0_2_;
    auVar19._30_2_ = auVar19._0_2_;
    auVar11._8_2_ = 8;
    auVar11._0_8_ = 0x8000800080008;
    auVar11._10_2_ = 8;
    auVar11._12_2_ = 8;
    auVar11._14_2_ = 8;
    auVar11._16_2_ = 8;
    auVar11._18_2_ = 8;
    auVar11._20_2_ = 8;
    auVar11._22_2_ = 8;
    auVar11._24_2_ = 8;
    auVar11._26_2_ = 8;
    auVar11._28_2_ = 8;
    auVar11._30_2_ = 8;
    for (lVar7 = 0; lVar7 < block_height; lVar7 = lVar7 + 2) {
      auVar13._0_16_ =
           ZEXT116(0) * *(undefined1 (*) [16])in +
           ZEXT116(1) * *(undefined1 (*) [16])((long)in + 0x120);
      auVar13._16_16_ =
           ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * *(undefined1 (*) [16])in;
      auVar12 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar4 * 2));
      auVar14 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar4 * 2));
      auVar17._16_16_ = auVar12;
      auVar17._0_16_ = auVar14;
      auVar12 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar4 * -2));
      auVar14 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar4 * -2 + 0x120));
      auVar25._16_16_ = auVar12;
      auVar25._0_16_ = auVar14;
      auVar18 = vpsubw_avx2(auVar17,auVar13);
      auVar36 = vpsraw_avx2(auVar18,0xf);
      auVar18 = vpabsw_avx2(auVar18);
      auVar28 = vpsrlw_avx2(auVar18,ZEXT416(uVar6));
      auVar28 = vpsubusw_avx2(auVar19,auVar28);
      auVar18 = vpminsw_avx2(auVar18,auVar28);
      auVar28 = vpaddw_avx2(auVar18,auVar36);
      auVar18 = vpsubw_avx2(auVar25,auVar13);
      auVar37 = vpsraw_avx2(auVar18,0xf);
      auVar18 = vpabsw_avx2(auVar18);
      auVar29 = vpsrlw_avx2(auVar18,ZEXT416(uVar6));
      auVar29 = vpsubusw_avx2(auVar19,auVar29);
      auVar18 = vpminsw_avx2(auVar18,auVar29);
      auVar18 = vpaddw_avx2(auVar18,auVar37);
      auVar18 = vpaddw_avx2(auVar18 ^ auVar37,auVar28 ^ auVar36);
      uVar1 = (undefined2)cdef_pri_taps[bVar10][0];
      auVar26._2_2_ = uVar1;
      auVar26._0_2_ = uVar1;
      auVar26._4_2_ = uVar1;
      auVar26._6_2_ = uVar1;
      auVar26._8_2_ = uVar1;
      auVar26._10_2_ = uVar1;
      auVar26._12_2_ = uVar1;
      auVar26._14_2_ = uVar1;
      auVar26._16_2_ = uVar1;
      auVar26._18_2_ = uVar1;
      auVar26._20_2_ = uVar1;
      auVar26._22_2_ = uVar1;
      auVar26._24_2_ = uVar1;
      auVar26._26_2_ = uVar1;
      auVar26._28_2_ = uVar1;
      auVar26._30_2_ = uVar1;
      auVar29 = vpmullw_avx2(auVar18,auVar26);
      auVar12 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])in + lVar5 * 2));
      auVar14 = vlddqu_avx(*(undefined1 (*) [16])
                            (*(undefined1 (*) [16])((long)in + 0x120) + lVar5 * 2));
      auVar27._16_16_ = auVar12;
      auVar27._0_16_ = auVar14;
      auVar12 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar5 * -2));
      auVar14 = vlddqu_avx(*(undefined1 (*) [16])((long)in + lVar5 * -2 + 0x120));
      auVar38._16_16_ = auVar12;
      auVar38._0_16_ = auVar14;
      auVar18 = vpsubw_avx2(auVar27,auVar13);
      auVar37 = vpsraw_avx2(auVar18,0xf);
      auVar18 = vpabsw_avx2(auVar18);
      auVar28 = vpsrlw_avx2(auVar18,ZEXT416(uVar6));
      auVar28 = vpsubusw_avx2(auVar19,auVar28);
      auVar18 = vpminsw_avx2(auVar28,auVar18);
      auVar28 = vpaddw_avx2(auVar18,auVar37);
      auVar18 = vpsubw_avx2(auVar38,auVar13);
      auVar46 = vpsraw_avx2(auVar18,0xf);
      auVar18 = vpabsw_avx2(auVar18);
      auVar36 = vpsrlw_avx2(auVar18,ZEXT416(uVar6));
      auVar36 = vpsubusw_avx2(auVar19,auVar36);
      auVar18 = vpminsw_avx2(auVar36,auVar18);
      auVar18 = vpaddw_avx2(auVar18,auVar46);
      auVar18 = vpaddw_avx2(auVar18 ^ auVar46,auVar28 ^ auVar37);
      uVar1 = (undefined2)cdef_pri_taps[bVar10][1];
      auVar39._2_2_ = uVar1;
      auVar39._0_2_ = uVar1;
      auVar39._4_2_ = uVar1;
      auVar39._6_2_ = uVar1;
      auVar39._8_2_ = uVar1;
      auVar39._10_2_ = uVar1;
      auVar39._12_2_ = uVar1;
      auVar39._14_2_ = uVar1;
      auVar39._16_2_ = uVar1;
      auVar39._18_2_ = uVar1;
      auVar39._20_2_ = uVar1;
      auVar39._22_2_ = uVar1;
      auVar39._24_2_ = uVar1;
      auVar39._26_2_ = uVar1;
      auVar39._28_2_ = uVar1;
      auVar39._30_2_ = uVar1;
      auVar18 = vpmullw_avx2(auVar18,auVar39);
      auVar18 = vpaddw_avx2(auVar18,auVar29);
      auVar28 = vpsraw_avx2(auVar18,0xf);
      auVar18 = vpaddw_avx2(auVar18,auVar11);
      auVar18 = vpaddw_avx2(auVar18,auVar28);
      auVar18 = vpsraw_avx2(auVar18,4);
      auVar18 = vpaddw_avx2(auVar18,auVar13);
      auVar18 = vpackuswb_avx2(auVar18,auVar19);
      *(long *)dest = auVar18._16_8_;
      *(long *)((long)dest + (long)dstride) = auVar18._0_8_;
      dest = (void *)((long)dest + (long)dstride * 2);
      in = (uint16_t *)((long)in + 0x240);
    }
  }
  else {
    uVar6 = pri_damping;
    if (pri_strength != 0) {
      iVar2 = 0x1f;
      if (pri_strength != 0) {
        for (; (uint)pri_strength >> iVar2 == 0; iVar2 = iVar2 + -1) {
        }
      }
      uVar6 = pri_damping - iVar2;
      if (pri_damping < iVar2) {
        uVar6 = 0;
      }
    }
    auVar18._2_2_ = auVar19._0_2_;
    auVar18._0_2_ = auVar19._0_2_;
    auVar18._4_2_ = auVar19._0_2_;
    auVar18._6_2_ = auVar19._0_2_;
    auVar18._8_2_ = auVar19._0_2_;
    auVar18._10_2_ = auVar19._0_2_;
    auVar18._12_2_ = auVar19._0_2_;
    auVar18._14_2_ = auVar19._0_2_;
    auVar18._16_2_ = auVar19._0_2_;
    auVar18._18_2_ = auVar19._0_2_;
    auVar18._20_2_ = auVar19._0_2_;
    auVar18._22_2_ = auVar19._0_2_;
    auVar18._24_2_ = auVar19._0_2_;
    auVar18._26_2_ = auVar19._0_2_;
    auVar18._28_2_ = auVar19._0_2_;
    auVar18._30_2_ = auVar19._0_2_;
    lVar3 = (long)dstride;
    lVar7 = lVar5 * -2;
    lVar8 = lVar4 * -2;
    auVar28._8_2_ = 8;
    auVar28._0_8_ = 0x8000800080008;
    auVar28._10_2_ = 8;
    auVar28._12_2_ = 8;
    auVar28._14_2_ = 8;
    auVar28._16_2_ = 8;
    auVar28._18_2_ = 8;
    auVar28._20_2_ = 8;
    auVar28._22_2_ = 8;
    auVar28._24_2_ = 8;
    auVar28._26_2_ = 8;
    auVar28._28_2_ = 8;
    auVar28._30_2_ = 8;
    for (lVar9 = 0; lVar9 < block_height; lVar9 = lVar9 + 4) {
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)in;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = *(ulong *)((long)in + 0x120);
      auVar12 = vpunpcklqdq_avx(auVar14,auVar12);
      auVar15._8_8_ = 0;
      auVar15._0_8_ = *(ulong *)((long)in + 0x240);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = *(ulong *)((long)in + 0x360);
      auVar14 = vpunpcklqdq_avx(auVar20,auVar15);
      auVar46._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar14;
      auVar46._16_16_ = ZEXT116(1) * auVar12;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = *(ulong *)((long)in + lVar4 * 2);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = *(ulong *)((long)in + lVar4 * 2 + 0x120);
      auVar12 = vpunpcklqdq_avx(auVar21,auVar16);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = *(ulong *)((long)in + lVar4 * 2 + 0x240);
      auVar30._8_8_ = 0;
      auVar30._0_8_ = *(ulong *)((long)in + lVar4 * 2 + 0x360);
      auVar14 = vpunpcklqdq_avx(auVar30,auVar22);
      auVar29._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar14;
      auVar29._16_16_ = ZEXT116(1) * auVar12;
      auVar19 = vpsubw_avx2(auVar29,auVar46);
      auVar37 = vpsraw_avx2(auVar19,0xf);
      auVar19 = vpabsw_avx2(auVar19);
      auVar29 = vpsrlw_avx2(auVar19,ZEXT416(uVar6));
      auVar29 = vpsubusw_avx2(auVar18,auVar29);
      auVar19 = vpminsw_avx2(auVar19,auVar29);
      auVar29 = vpaddw_avx2(auVar19,auVar37);
      auVar23._8_8_ = 0;
      auVar23._0_8_ = *(ulong *)((long)in + lVar8);
      auVar31._8_8_ = 0;
      auVar31._0_8_ = *(ulong *)((long)in + lVar8 + 0x120);
      auVar12 = vpunpcklqdq_avx(auVar31,auVar23);
      auVar32._8_8_ = 0;
      auVar32._0_8_ = *(ulong *)((long)in + lVar8 + 0x240);
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)((long)in + lVar8 + 0x360);
      auVar14 = vpunpcklqdq_avx(auVar42,auVar32);
      auVar36._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar14;
      auVar36._16_16_ = ZEXT116(1) * auVar12;
      auVar19 = vpsubw_avx2(auVar36,auVar46);
      auVar40 = vpsraw_avx2(auVar19,0xf);
      auVar19 = vpabsw_avx2(auVar19);
      auVar36 = vpsrlw_avx2(auVar19,ZEXT416(uVar6));
      auVar36 = vpsubusw_avx2(auVar18,auVar36);
      auVar19 = vpminsw_avx2(auVar19,auVar36);
      auVar19 = vpaddw_avx2(auVar19,auVar40);
      auVar19 = vpaddw_avx2(auVar19 ^ auVar40,auVar29 ^ auVar37);
      uVar1 = (undefined2)cdef_pri_taps[bVar10][0];
      auVar37._2_2_ = uVar1;
      auVar37._0_2_ = uVar1;
      auVar37._4_2_ = uVar1;
      auVar37._6_2_ = uVar1;
      auVar37._8_2_ = uVar1;
      auVar37._10_2_ = uVar1;
      auVar37._12_2_ = uVar1;
      auVar37._14_2_ = uVar1;
      auVar37._16_2_ = uVar1;
      auVar37._18_2_ = uVar1;
      auVar37._20_2_ = uVar1;
      auVar37._22_2_ = uVar1;
      auVar37._24_2_ = uVar1;
      auVar37._26_2_ = uVar1;
      auVar37._28_2_ = uVar1;
      auVar37._30_2_ = uVar1;
      auVar36 = vpmullw_avx2(auVar19,auVar37);
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *(ulong *)((long)in + lVar5 * 2);
      auVar33._8_8_ = 0;
      auVar33._0_8_ = *(ulong *)((long)in + lVar5 * 2 + 0x120);
      auVar12 = vpunpcklqdq_avx(auVar33,auVar24);
      auVar34._8_8_ = 0;
      auVar34._0_8_ = *(ulong *)((long)in + lVar5 * 2 + 0x240);
      auVar43._8_8_ = 0;
      auVar43._0_8_ = *(ulong *)((long)in + lVar5 * 2 + 0x360);
      auVar14 = vpunpcklqdq_avx(auVar43,auVar34);
      auVar40._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar14;
      auVar40._16_16_ = ZEXT116(1) * auVar12;
      auVar19 = vpsubw_avx2(auVar40,auVar46);
      auVar40 = vpsraw_avx2(auVar19,0xf);
      auVar19 = vpabsw_avx2(auVar19);
      auVar29 = vpsrlw_avx2(auVar19,ZEXT416(uVar6));
      auVar29 = vpsubusw_avx2(auVar18,auVar29);
      auVar19 = vpminsw_avx2(auVar19,auVar29);
      auVar29 = vpaddw_avx2(auVar19,auVar40);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)((long)in + lVar7);
      auVar44._8_8_ = 0;
      auVar44._0_8_ = *(ulong *)((long)in + lVar7 + 0x120);
      auVar12 = vpunpcklqdq_avx(auVar44,auVar35);
      auVar45._8_8_ = 0;
      auVar45._0_8_ = *(ulong *)((long)in + lVar7 + 0x240);
      auVar48._8_8_ = 0;
      auVar48._0_8_ = *(ulong *)((long)in + lVar7 + 0x360);
      auVar14 = vpunpcklqdq_avx(auVar48,auVar45);
      auVar47._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar14;
      auVar47._16_16_ = ZEXT116(1) * auVar12;
      auVar19 = vpsubw_avx2(auVar47,auVar46);
      auVar47 = vpsraw_avx2(auVar19,0xf);
      auVar19 = vpabsw_avx2(auVar19);
      auVar37 = vpsrlw_avx2(auVar19,ZEXT416(uVar6));
      auVar37 = vpsubusw_avx2(auVar18,auVar37);
      auVar19 = vpminsw_avx2(auVar37,auVar19);
      auVar19 = vpaddw_avx2(auVar19,auVar47);
      auVar19 = vpaddw_avx2(auVar19 ^ auVar47,auVar29 ^ auVar40);
      uVar1 = (undefined2)cdef_pri_taps[bVar10][1];
      auVar41._2_2_ = uVar1;
      auVar41._0_2_ = uVar1;
      auVar41._4_2_ = uVar1;
      auVar41._6_2_ = uVar1;
      auVar41._8_2_ = uVar1;
      auVar41._10_2_ = uVar1;
      auVar41._12_2_ = uVar1;
      auVar41._14_2_ = uVar1;
      auVar41._16_2_ = uVar1;
      auVar41._18_2_ = uVar1;
      auVar41._20_2_ = uVar1;
      auVar41._22_2_ = uVar1;
      auVar41._24_2_ = uVar1;
      auVar41._26_2_ = uVar1;
      auVar41._28_2_ = uVar1;
      auVar41._30_2_ = uVar1;
      auVar19 = vpmullw_avx2(auVar19,auVar41);
      auVar19 = vpaddw_avx2(auVar19,auVar36);
      auVar29 = vpsraw_avx2(auVar19,0xf);
      auVar19 = vpaddw_avx2(auVar19,auVar28);
      auVar19 = vpaddw_avx2(auVar19,auVar29);
      auVar19 = vpsraw_avx2(auVar19,4);
      auVar19 = vpaddw_avx2(auVar19,auVar46);
      auVar19 = vpackuswb_avx2(auVar19,auVar18);
      *(int *)dest = auVar19._20_4_;
      *(int *)((long)dest + lVar3) = auVar19._16_4_;
      *(int *)((long)dest + lVar3 * 2) = auVar19._4_4_;
      *(int *)((long)dest + lVar3 * 3) = auVar19._0_4_;
      dest = (void *)((long)dest + lVar3 * 4);
      in = (uint16_t *)((long)in + 0x480);
    }
  }
  return;
}

Assistant:

void SIMD_FUNC(cdef_filter_8_1)(void *dest, int dstride, const uint16_t *in,
                                int pri_strength, int sec_strength, int dir,
                                int pri_damping, int sec_damping,
                                int coeff_shift, int block_width,
                                int block_height) {
  if (block_width == 8) {
    filter_block_8x8(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  } else {
    filter_block_4x4(/*is_lowbd=*/1, dest, dstride, in, pri_strength,
                     sec_strength, dir, pri_damping, sec_damping, coeff_shift,
                     block_height, /*enable_primary=*/1,
                     /*enable_secondary=*/0);
  }
}